

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.h
# Opt level: O2

void __thiscall cfd::core::TxInReference::TxInReference(TxInReference *this,TxInReference *param_1)

{
  AbstractTxInReference::AbstractTxInReference
            (&this->super_AbstractTxInReference,&param_1->super_AbstractTxInReference);
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__AbstractTxInReference_00276d40;
  return;
}

Assistant:

class CFD_CORE_EXPORT TxInReference : public AbstractTxInReference {
 public:
  /**
   * @brief constructor.
   * @param[in] tx_in TxIn instance to reference
   */
  explicit TxInReference(const TxIn& tx_in);
  /**
   * @brief default constructor.
   */
  TxInReference() : TxInReference(TxIn(Txid(), 0, 0)) {
    // do nothing
  }

  /**
   * @brief destructor
   */
  virtual ~TxInReference() {
    // do nothing
  }
}